

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagegenerator.cpp
# Opt level: O2

void __thiscall
stackjit::AssemblyImageGenerator::generateImage
          (AssemblyImageGenerator *this,
          vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>
          *assemblies,ostream *stream)

{
  pointer pAVar1;
  pointer pFVar2;
  Assembly *pAVar3;
  pointer pCVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_> *pvVar7;
  vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_> *pvVar8;
  string *psVar9;
  mapped_type *pmVar10;
  Function *function;
  Function *extraout_RDX;
  Function *function_00;
  Function *extraout_RDX_00;
  Assembly *assembly_1;
  unsigned_long value;
  pointer pFVar11;
  Assembly *this_00;
  pointer pCVar12;
  pointer this_01;
  AssemblyImageGenerator *this_02;
  Class *classDef;
  Function *func;
  pointer pFVar13;
  Assembly *assembly;
  pointer this_03;
  unsigned_long value_00;
  BinaryData data;
  vector<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_> *__range1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  classBodyOffsets;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  funcBodyOffsets;
  undefined1 local_108 [56];
  string local_d0;
  __buckets_ptr local_b0;
  ostream *local_a8;
  undefined1 local_a0 [24];
  size_t sStack_88;
  __node_base_ptr local_80;
  size_t local_78;
  _Hash_node_base _Stack_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_108._16_8_ = (pointer)0x0;
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (pointer)0x0;
  pAVar1 = (assemblies->
           super__Vector_base<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  value = 0;
  value_00 = 0;
  local_108._40_8_ = assemblies;
  local_a8 = stream;
  for (this_03 = (assemblies->
                 super__Vector_base<stackjit::Loader::Assembly,_std::allocator<stackjit::Loader::Assembly>_>
                 )._M_impl.super__Vector_impl_data._M_start; this_03 != pAVar1;
      this_03 = this_03 + 1) {
    pvVar7 = Loader::Assembly::functions(this_03);
    pFVar13 = (pvVar7->
              super__Vector_base<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pFVar2 = (pvVar7->
             super__Vector_base<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pvVar8 = Loader::Assembly::classes(this_03);
    value_00 = value_00 + ((long)pFVar2 - (long)pFVar13) / 0x110;
    value = value + ((long)(pvVar8->
                           super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar8->
                          super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>
                          )._M_impl.super__Vector_impl_data._M_start) / 0x90;
  }
  anon_unknown_3::addData<unsigned_long>((BinaryData *)local_108,value_00);
  anon_unknown_3::addData<unsigned_long>((BinaryData *)local_108,value);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_108._48_8_ = ((string *)local_108._40_8_)->_M_string_length;
  pCVar12 = (pointer)(((_Vector_impl *)&((string *)local_108._40_8_)->_M_dataplus)->
                     super__Vector_impl_data)._M_start;
  while (pCVar12 != (pointer)local_108._48_8_) {
    local_108._32_8_ = pCVar12;
    pvVar7 = Loader::Assembly::functions((Assembly *)pCVar12);
    pFVar2 = (pvVar7->
             super__Vector_base<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pFVar13 = (pvVar7->
                   super__Vector_base<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
                   )._M_impl.super__Vector_impl_data._M_start; pFVar13 != pFVar2;
        pFVar13 = pFVar13 + 1) {
      generateFunctionDefinition((AssemblyImageGenerator *)pCVar12,(BinaryData *)local_108,pFVar13);
      Loader::getSignature_abi_cxx11_(&local_d0,(Loader *)pFVar13,function);
      local_a0._8_8_ = local_d0._M_string_length;
      local_80 = (__node_base_ptr)(local_108._8_8_ + -local_108._0_8_);
      local_a0._0_8_ = local_a0 + 0x10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        local_a0._0_8_ = local_d0._M_dataplus._M_p;
      }
      local_a0._20_4_ = local_d0.field_2._M_allocated_capacity._4_4_;
      local_a0._16_4_ = local_d0.field_2._M_allocated_capacity._0_4_;
      local_d0._M_string_length = 0;
      local_d0.field_2._M_allocated_capacity._0_4_ =
           local_d0.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string_const,unsigned_long>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_68);
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string((string *)&local_d0);
      pCVar12 = (pointer)local_108;
      anon_unknown_3::addData<unsigned_long>((BinaryData *)local_108,0);
    }
    pCVar12 = (pointer)(local_108._32_8_ + 0x50);
  }
  local_a0._0_8_ = &_Stack_70;
  local_a0._8_8_ = (__node_base_ptr)0x1;
  local_a0._16_8_ = (_Hash_node_base *)0x0;
  sStack_88 = 0;
  local_80 = (__node_base_ptr)CONCAT44(local_80._4_4_,0x3f800000);
  local_78 = 0;
  _Stack_70._M_nxt = (_Hash_node_base *)0x0;
  local_108._48_8_ = ((string *)local_108._40_8_)->_M_string_length;
  for (pFVar11 = (pointer)(((_Vector_impl *)&((string *)local_108._40_8_)->_M_dataplus)->
                          super__Vector_impl_data)._M_start; pFVar11 != (pointer)local_108._48_8_;
      pFVar11 = (pointer)&(pFVar11->mAttributes)._M_h._M_before_begin) {
    this_01 = pFVar11;
    pvVar8 = Loader::Assembly::classes((Assembly *)pFVar11);
    local_108._32_8_ =
         (pvVar8->
         super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    for (pCVar12 = (pvVar8->
                   super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>
                   )._M_impl.super__Vector_impl_data._M_start; pCVar12 != (pointer)local_108._32_8_;
        pCVar12 = pCVar12 + 1) {
      generateClassDefinition((AssemblyImageGenerator *)this_01,(BinaryData *)local_108,pCVar12);
      psVar9 = Loader::Class::name_abi_cxx11_(pCVar12);
      uVar6 = local_108._8_8_;
      uVar5 = local_108._0_8_;
      std::__cxx11::string::string((string *)&local_d0,(string *)psVar9);
      local_b0 = (__buckets_ptr)(uVar6 + -uVar5);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string_const,unsigned_long>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_a0);
      std::__cxx11::string::~string((string *)&local_d0);
      this_01 = (pointer)local_108;
      anon_unknown_3::addData<unsigned_long>((BinaryData *)local_108,0);
    }
  }
  local_108._32_8_ = ((string *)local_108._40_8_)->_M_string_length;
  for (pFVar11 = (pointer)(((_Vector_impl *)&((string *)local_108._40_8_)->_M_dataplus)->
                          super__Vector_impl_data)._M_start; pFVar11 != (pointer)local_108._32_8_;
      pFVar11 = (pointer)&(pFVar11->mAttributes)._M_h._M_before_begin) {
    pvVar7 = Loader::Assembly::functions((Assembly *)pFVar11);
    pFVar2 = (pvVar7->
             super__Vector_base<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    function_00 = extraout_RDX;
    for (pFVar13 = (pvVar7->
                   super__Vector_base<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>
                   )._M_impl.super__Vector_impl_data._M_start; pFVar13 != pFVar2;
        pFVar13 = pFVar13 + 1) {
      Loader::getSignature_abi_cxx11_(&local_d0,(Loader *)pFVar13,function_00);
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)&local_68,&local_d0);
      anon_unknown_3::setData<unsigned_long>
                ((BinaryData *)local_108,*pmVar10,local_108._8_8_ - local_108._0_8_);
      psVar9 = &local_d0;
      std::__cxx11::string::~string((string *)&local_d0);
      generateFunctionBody((AssemblyImageGenerator *)psVar9,(BinaryData *)local_108,pFVar13);
      function_00 = extraout_RDX_00;
    }
  }
  pAVar3 = (Assembly *)((string *)local_108._40_8_)->_M_string_length;
  for (this_00 = (((_Vector_impl *)&((string *)local_108._40_8_)->_M_dataplus)->
                 super__Vector_impl_data)._M_start; this_00 != pAVar3; this_00 = this_00 + 1) {
    pvVar8 = Loader::Assembly::classes(this_00);
    pCVar4 = (pvVar8->
             super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (pCVar12 = (pvVar8->
                   super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>
                   )._M_impl.super__Vector_impl_data._M_start; pCVar12 != pCVar4;
        pCVar12 = pCVar12 + 1) {
      psVar9 = Loader::Class::name_abi_cxx11_(pCVar12);
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)local_a0,psVar9);
      this_02 = (AssemblyImageGenerator *)local_108;
      anon_unknown_3::setData<unsigned_long>
                ((BinaryData *)local_108,*pmVar10,local_108._8_8_ - local_108._0_8_);
      generateClassBody(this_02,(BinaryData *)local_108,pCVar12);
    }
  }
  std::ostream::write((char *)local_a8,local_108._0_8_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_a0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)local_108);
  return;
}

Assistant:

void AssemblyImageGenerator::generateImage(std::vector<Loader::Assembly>& assemblies, std::ostream& stream) {
		BinaryData data;

		//Compute the number of functions & classes
		std::size_t numFuncs = 0;
		std::size_t numClasses = 0;
		for (auto& assembly : assemblies) {
			numFuncs += assembly.functions().size();
			numClasses += assembly.classes().size();
		}

		//Header
		addData(data, numFuncs);
		addData(data, numClasses);

		//Functions definitions
		std::unordered_map<std::string, std::size_t> funcBodyOffsets;

		for (auto& assembly : assemblies) {
			for (auto& func : assembly.functions()) {
				generateFunctionDefinition(data, func);
				funcBodyOffsets.insert({ Loader::getSignature(func), data.size() });
				addData<std::size_t>(data, 0);
			}
		}

		//Class definitions
		std::unordered_map<std::string, std::size_t> classBodyOffsets;

		for (auto& assembly : assemblies) {
			for (auto& classDef : assembly.classes()) {
				generateClassDefinition(data, classDef);
				classBodyOffsets.insert({ classDef.name(), data.size() });
				addData<std::size_t>(data, 0);
			}
		}

		//Functions bodies
		for (auto& assembly : assemblies) {
			for (auto& func : assembly.functions()) {
				//Patch the offset
				setData<std::size_t>(data, funcBodyOffsets.at(Loader::getSignature(func)), data.size());
				generateFunctionBody(data, func);
			}
		}

		//Class bodies
		for (auto& assembly : assemblies) {
			for (auto& classDef : assembly.classes()) {
				//Patch the offset
				setData<std::size_t>(data, classBodyOffsets.at(classDef.name()), data.size());
				generateClassBody(data, classDef);
			}
		}

		//Write to the stream
		stream.write(data.data(), data.size());
	}